

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O1

bool __thiscall
ON_SubDMatrix::EvaluateSubdivisionPoint
          (ON_SubDMatrix *this,uint element_index,double *point_ring,size_t point_ring_count,
          size_t point_ring_stride,double *subd_point)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  double **ppdVar5;
  bool bVar6;
  double *pdVar7;
  double *pdVar8;
  double dVar9;
  double dVar10;
  
  ppdVar5 = this->m_S;
  if (((ppdVar5 == (double **)0x0) || (uVar4 = this->m_R, uVar4 <= element_index)) ||
     (uVar4 != point_ring_count ||
      (point_ring == (double *)0x0 || (point_ring_stride < 3 || point_ring_count < 4)))) {
    ON_SubDIncrementErrorCount();
    bVar6 = false;
  }
  else {
    *subd_point = 0.0;
    subd_point[1] = 0.0;
    subd_point[2] = 0.0;
    pdVar7 = ppdVar5[element_index];
    pdVar1 = pdVar7 + uVar4;
    dVar2 = subd_point[1];
    dVar9 = subd_point[2];
    pdVar8 = point_ring + 2;
    dVar10 = 0.0;
    do {
      dVar3 = *pdVar7;
      pdVar7 = pdVar7 + 1;
      dVar10 = dVar10 + pdVar8[-2] * dVar3;
      *subd_point = dVar10;
      dVar2 = dVar2 + pdVar8[-1] * dVar3;
      subd_point[1] = dVar2;
      dVar9 = dVar9 + dVar3 * *pdVar8;
      subd_point[2] = dVar9;
      pdVar8 = pdVar8 + point_ring_stride;
    } while (pdVar7 < pdVar1);
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool ON_SubDMatrix::EvaluateSubdivisionPoint(
  unsigned int element_index,
  const double* point_ring,
  size_t point_ring_count,
  size_t point_ring_stride,
  double subd_point[3]
  ) const
{
  if ( nullptr == m_S || element_index >= m_R )
    return ON_SUBD_RETURN_ERROR(false);
  if (false == IsValidPointRing(point_ring,point_ring_count,point_ring_stride))
    return ON_SUBD_RETURN_ERROR(false);
 
  subd_point[0] = 0.0;
  subd_point[1] = 0.0;
  subd_point[2] = 0.0;
  double c;
  const double* s = m_S[element_index];
  const double* s1 = s + m_R;
  while (s < s1)
  {
    c = *s++;
    subd_point[0] += c*point_ring[0];
    subd_point[1] += c*point_ring[1];
    subd_point[2] += c*point_ring[2];
    point_ring += point_ring_stride;
  }

  return true;
}